

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_f4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_f4 = number;
  if (number == 0) {
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar3[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
      local_f0 = (long *)*plVar3;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    local_40[0] = local_a0;
    puVar7 = local_b0;
    if (local_b0 == &local_a0) goto LAB_0010d78c;
  }
  else {
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    StreamableToString<int>(&local_90,&local_f4);
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < local_90._M_string_length + local_48) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar6 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_90._M_string_length + local_48) goto LAB_0010d518;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_0010d518:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_c0 = *plVar3;
      uStack_b8 = puVar2[3];
    }
    else {
      local_c0 = *plVar3;
      local_d0 = (long *)*puVar2;
    }
    local_c8 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_a0 = *puVar7;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar7;
      local_b0 = (ulong *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar3[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
      local_f0 = (long *)*plVar3;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    puVar7 = local_50;
    if (local_50 == local_40) goto LAB_0010d78c;
  }
  operator_delete(puVar7,local_40[0] + 1);
LAB_0010d78c:
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_70,local_70 + local_68);
  Normalize((FilePath *)&local_f0);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}